

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WithFunctionSampleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WithFunctionSampleSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::FunctionPortListSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,
          FunctionPortListSyntax **args_3)

{
  Token sample;
  WithFunctionSampleSyntax *this_00;
  Token *in_RCX;
  Token *in_RDX;
  long in_RSI;
  Info *in_R8;
  FunctionPortListSyntax *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  this_00 = (WithFunctionSampleSyntax *)
            allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (size_t)in_stack_ffffffffffffff98);
  sample.info = in_R8;
  sample._0_8_ = *(undefined8 *)(in_RSI + 8);
  slang::syntax::WithFunctionSampleSyntax::WithFunctionSampleSyntax
            (this_00,*in_RDX,*in_RCX,sample,in_stack_ffffffffffffff98);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }